

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::Detail::rangeToString<wchar_t_const*,wchar_t_const*>(wchar_t *first,wchar_t *last)

{
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string local_80 [16];
  ReusableStringStream *in_stack_ffffffffffffff90;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  long local_10;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  if (in_RSI != in_RDX) {
    stringify<wchar_t>((wchar_t *)in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    while (local_10 = in_RSI + 4, local_10 != in_RDX) {
      in_stack_ffffffffffffff60 =
           ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
      stringify<wchar_t>((wchar_t *)in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_80);
      in_RSI = local_10;
    }
  }
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }